

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<char>::emplace_back<char>(SmallVectorBase<char> *this,char *args)

{
  iterator pcVar1;
  char *args_local;
  SmallVectorBase<char> *this_local;
  
  if (this->len == this->cap) {
    pcVar1 = end(this);
    this_local = (SmallVectorBase<char> *)emplaceRealloc<char>(this,pcVar1,args);
  }
  else {
    pcVar1 = end(this);
    *pcVar1 = *args;
    this->len = this->len + 1;
    this_local = (SmallVectorBase<char> *)back(this);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }